

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_operators.hpp
# Opt level: O2

void duckdb::FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
               (ColumnWriterStatistics *stats,float target_value)

{
  bool bVar1;
  float *right;
  float local_14;
  
  local_14 = target_value;
  bVar1 = Value::IsNan<float>(target_value);
  if (bVar1) {
    *(undefined1 *)&stats[2]._vptr_ColumnWriterStatistics = 1;
  }
  else {
    bVar1 = GreaterThan::Operation<float>((float *)(stats + 1),&local_14);
    if (bVar1) {
      *(float *)&stats[1]._vptr_ColumnWriterStatistics = local_14;
    }
    right = (float *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4);
    bVar1 = GreaterThan::Operation<float>(&local_14,right);
    if (bVar1) {
      *right = local_14;
    }
  }
  return;
}

Assistant:

static void HandleStats(ColumnWriterStatistics *stats, TGT target_value) {
		auto &numeric_stats = stats->Cast<FloatingPointStatisticsState<SRC, TGT, BaseParquetOperator>>();
		if (Value::IsNan(target_value)) {
			numeric_stats.has_nan = true;
		} else {
			if (LessThan::Operation(target_value, numeric_stats.min)) {
				numeric_stats.min = target_value;
			}
			if (GreaterThan::Operation(target_value, numeric_stats.max)) {
				numeric_stats.max = target_value;
			}
		}
	}